

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-desc.c
# Opt level: O0

size_t obj_desc_aware(object *obj,char *buf,size_t max,size_t end)

{
  _Bool _Var1;
  size_t local_28;
  size_t end_local;
  size_t max_local;
  char *buf_local;
  object *obj_local;
  
  local_28 = end;
  end_local = max;
  max_local = (size_t)buf;
  buf_local = (char *)obj;
  _Var1 = object_flavor_is_aware(obj);
  if (_Var1) {
    _Var1 = object_runes_known((object *)buf_local);
    if (_Var1) {
      if (*(long *)(*(long *)(buf_local + 0x28) + 0xf8) != 0) {
        strnfcat((char *)max_local,end_local,&local_28," {cursed}");
      }
    }
    else {
      strnfcat((char *)max_local,end_local,&local_28," {??}");
    }
  }
  else {
    strnfcat((char *)max_local,end_local,&local_28," {unseen}");
  }
  return local_28;
}

Assistant:

static size_t obj_desc_aware(const struct object *obj, char *buf, size_t max,
							 size_t end)
{
	if (!object_flavor_is_aware(obj)) {
		strnfcat(buf, max, &end, " {unseen}");
	} else if (!object_runes_known(obj)) {
		strnfcat(buf, max, &end, " {??}");
	} else if (obj->known->curses) {
		strnfcat(buf, max, &end, " {cursed}");
	}

	return end;
}